

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.c
# Opt level: O0

AttVal * prvTidyNewAttributeEx(TidyDocImpl *doc,ctmbstr name,ctmbstr value,int delim)

{
  AttVal *attval;
  tmbstr ptVar1;
  Attribute *pAVar2;
  AttVal *av;
  int delim_local;
  ctmbstr value_local;
  ctmbstr name_local;
  TidyDocImpl *doc_local;
  
  attval = prvTidyNewAttribute(doc);
  ptVar1 = prvTidytmbstrdup(doc->allocator,name);
  attval->attribute = ptVar1;
  ptVar1 = prvTidytmbstrdup(doc->allocator,value);
  attval->value = ptVar1;
  attval->delim = delim;
  pAVar2 = prvTidyFindAttribute(doc,attval);
  attval->dict = pAVar2;
  return attval;
}

Assistant:

AttVal* TY_(NewAttributeEx)( TidyDocImpl* doc, ctmbstr name, ctmbstr value,
                             int delim )
{
    AttVal *av = TY_(NewAttribute)(doc);
    av->attribute = TY_(tmbstrdup)(doc->allocator, name);
    av->value = TY_(tmbstrdup)(doc->allocator, value);
    av->delim = delim;
    av->dict = TY_(FindAttribute)( doc, av );
    return av;
}